

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_solid_destination_in(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_24;
  uint32_t local_20;
  int i;
  uint32_t a;
  uint32_t const_alpha_local;
  uint32_t color_local;
  int length_local;
  uint32_t *dest_local;
  
  local_20 = color >> 0x18;
  if (const_alpha != 0xff) {
    uVar1 = BYTE_MUL(local_20,const_alpha);
    local_20 = (uVar1 + 0xff) - const_alpha;
  }
  for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
    uVar1 = BYTE_MUL(dest[local_24],local_20);
    dest[local_24] = uVar1;
  }
  return;
}

Assistant:

static void composition_solid_destination_in(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    uint32_t a = plutovg_alpha(color);
    if(const_alpha != 255)
        a = BYTE_MUL(a, const_alpha) + 255 - const_alpha;
    for(int i = 0; i < length; i++) {
        dest[i] = BYTE_MUL(dest[i], a);
    }
}